

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu-quants.c
# Opt level: O0

void ggml_vec_dot_iq2_s_q8_K(int n,float *s,size_t bs,void *vx,size_t bx,void *vy,size_t by,int nrc)

{
  long lVar1;
  byte bVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  ulong *puVar10;
  ulong *puVar11;
  ulong *puVar12;
  ulong *puVar13;
  ulong *puVar14;
  ulong *puVar15;
  __m256 x_00;
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  ulong *puVar29;
  long in_RCX;
  float *in_RSI;
  int in_EDI;
  uint uVar30;
  long in_R9;
  float fVar31;
  undefined8 uVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined8 uVar36;
  undefined8 uVar37;
  undefined8 uVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  __m256i p2;
  __m256i p1;
  __m256i dot2;
  __m256i dot1;
  __m256i q8s_2;
  __m256i s2_2;
  __m256i q8s_1;
  __m256i s2_1;
  __m256i aux256;
  __m256i q2_2;
  __m256i q2_1;
  __m256i q8_2;
  __m256i q8_1;
  int ib32;
  __m256i sumi2;
  __m256i sumi1;
  __m256i scales16;
  __m128i scales8;
  int8_t *q8;
  uint16_t *signs;
  uint8_t *qh;
  uint8_t *qs;
  float d;
  int i;
  __m256 accumf;
  uint64_t aux64;
  __m256i mask2;
  __m256i mask1;
  __m128i m1;
  __m128i m4;
  int nb;
  block_q8_K *y;
  block_iq2_s *x;
  uint in_stack_fffffffffffff398;
  uint in_stack_fffffffffffff39c;
  undefined8 in_stack_fffffffffffff3a0;
  undefined8 in_stack_fffffffffffff3a8;
  undefined8 in_stack_fffffffffffff3b0;
  ulong local_b20;
  ulong uStack_b18;
  ulong uStack_b10;
  ulong uStack_b08;
  ulong local_ae0;
  ulong uStack_ad8;
  ulong uStack_ad0;
  ulong uStack_ac8;
  uint local_a04;
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined8 uStack_9b0;
  undefined8 uStack_9a8;
  ulong *local_988;
  uint *local_980;
  byte *local_970;
  int local_964;
  undefined1 local_960 [16];
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  
  if (in_EDI < 0) {
    in_EDI = in_EDI + 0xff;
  }
  auVar4 = vpinsrb_avx(ZEXT116(0xf),0xf,1);
  auVar4 = vpinsrb_avx(auVar4,0xf,2);
  auVar4 = vpinsrb_avx(auVar4,0xf,3);
  auVar4 = vpinsrb_avx(auVar4,0xf,4);
  auVar4 = vpinsrb_avx(auVar4,0xf,5);
  auVar4 = vpinsrb_avx(auVar4,0xf,6);
  auVar4 = vpinsrb_avx(auVar4,0xf,7);
  auVar4 = vpinsrb_avx(auVar4,0xf,8);
  auVar4 = vpinsrb_avx(auVar4,0xf,9);
  auVar4 = vpinsrb_avx(auVar4,0xf,10);
  auVar4 = vpinsrb_avx(auVar4,0xf,0xb);
  auVar4 = vpinsrb_avx(auVar4,0xf,0xc);
  auVar4 = vpinsrb_avx(auVar4,0xf,0xd);
  auVar4 = vpinsrb_avx(auVar4,0xf,0xe);
  auVar4 = vpinsrb_avx(auVar4,0xf,0xf);
  auVar5 = vpinsrb_avx(ZEXT116(1),1,1);
  auVar5 = vpinsrb_avx(auVar5,1,2);
  auVar5 = vpinsrb_avx(auVar5,1,3);
  auVar5 = vpinsrb_avx(auVar5,1,4);
  auVar5 = vpinsrb_avx(auVar5,1,5);
  auVar5 = vpinsrb_avx(auVar5,1,6);
  auVar5 = vpinsrb_avx(auVar5,1,7);
  auVar5 = vpinsrb_avx(auVar5,1,8);
  auVar5 = vpinsrb_avx(auVar5,1,9);
  auVar5 = vpinsrb_avx(auVar5,1,10);
  auVar5 = vpinsrb_avx(auVar5,1,0xb);
  auVar5 = vpinsrb_avx(auVar5,1,0xc);
  auVar5 = vpinsrb_avx(auVar5,1,0xd);
  auVar5 = vpinsrb_avx(auVar5,1,0xe);
  auVar5 = vpinsrb_avx(auVar5,1,0xf);
  local_960 = ZEXT816(0);
  for (local_964 = 0; local_964 < in_EDI >> 8; local_964 = local_964 + 1) {
    fVar31 = ggml_lookup_fp16_to_fp32(*(ggml_fp16_t *)(in_RCX + (long)local_964 * 0x52));
    fVar31 = fVar31 * *(float *)(in_R9 + (long)local_964 * 0x124);
    local_970 = (byte *)(in_RCX + 2 + (long)local_964 * 0x52);
    lVar1 = in_RCX + 0x42 + (long)local_964 * 0x52;
    local_980 = (uint *)(in_RCX + 0x22 + (long)local_964 * 0x52);
    local_988 = (ulong *)(in_R9 + 4 + (long)local_964 * 0x124);
    uVar3 = *(ulong *)(in_RCX + 0x4a + (long)local_964 * 0x52);
    auVar33._8_8_ = 0;
    auVar33._0_8_ = uVar3;
    auVar39._8_8_ = 0;
    auVar39._0_8_ = uVar3 >> 4;
    auVar33 = vpunpcklqdq_avx(auVar33,auVar39);
    auVar33 = vpand_avx(auVar33,auVar4);
    auVar33 = vpsllw_avx(auVar33,ZEXT416(1));
    auVar33 = vpaddb_avx(auVar33,auVar5);
    auVar6 = vpmovsxbw_avx2(auVar33);
    local_9e0 = ZEXT1632(ZEXT816(0));
    local_a00 = ZEXT1632(ZEXT816(0));
    local_a04 = 0;
    while( true ) {
      if (7 < (int)local_a04) break;
      uVar3 = *local_988;
      puVar10 = local_988 + 1;
      puVar11 = local_988 + 2;
      puVar12 = local_988 + 3;
      puVar29 = local_988 + 4;
      puVar13 = local_988 + 5;
      puVar14 = local_988 + 6;
      puVar15 = local_988 + 7;
      local_988 = local_988 + 8;
      bVar2 = *(byte *)(lVar1 + (int)local_a04);
      uVar30 = (uint)bVar2;
      auVar34._8_8_ = 0;
      auVar34._0_8_ = iq2s_grid[(uint)*local_970 | (uVar30 & 3) << 8];
      auVar40._8_8_ = 0;
      auVar40._0_8_ = iq2s_grid[(uint)local_970[1] | (uVar30 & 0xc) << 6];
      auVar34 = vpunpcklqdq_avx(auVar34,auVar40);
      auVar41._8_8_ = 0;
      auVar41._0_8_ = iq2s_grid[(uint)local_970[2] | (bVar2 & 0x30) << 4];
      auVar44._8_8_ = 0;
      auVar44._0_8_ = iq2s_grid[(uint)local_970[3] + (uVar30 & 0xffffffc0) * 4];
      auVar33 = vpunpcklqdq_avx(auVar41,auVar44);
      uStack_2b0 = auVar33._0_8_;
      uStack_2a8 = auVar33._8_8_;
      bVar2 = *(byte *)((long)(int)local_a04 + 1 + lVar1);
      uVar30 = (uint)bVar2;
      auVar35._8_8_ = 0;
      auVar35._0_8_ = iq2s_grid[(uint)local_970[4] | (uVar30 & 3) << 8];
      auVar42._8_8_ = 0;
      auVar42._0_8_ = iq2s_grid[(uint)local_970[5] | (uVar30 & 0xc) << 6];
      auVar35 = vpunpcklqdq_avx(auVar35,auVar42);
      auVar43._8_8_ = 0;
      auVar43._0_8_ = iq2s_grid[(uint)local_970[6] | (bVar2 & 0x30) << 4];
      auVar45._8_8_ = 0;
      auVar45._0_8_ = iq2s_grid[(uint)local_970[7] + (uVar30 & 0xffffffc0) * 4];
      auVar33 = vpunpcklqdq_avx(auVar43,auVar45);
      uStack_2f0 = auVar33._0_8_;
      uStack_2e8 = auVar33._8_8_;
      local_970 = local_970 + 8;
      in_stack_fffffffffffff398 = *local_980;
      auVar33 = vpinsrd_avx(ZEXT416(in_stack_fffffffffffff398),in_stack_fffffffffffff398,1);
      auVar33 = vpinsrd_avx(auVar33,in_stack_fffffffffffff398,2);
      auVar33 = vpinsrd_avx(auVar33,in_stack_fffffffffffff398,3);
      auVar39 = vpinsrd_avx(ZEXT416(in_stack_fffffffffffff398),in_stack_fffffffffffff398,1);
      auVar39 = vpinsrd_avx(auVar39,in_stack_fffffffffffff398,2);
      auVar39 = vpinsrd_avx(auVar39,in_stack_fffffffffffff398,3);
      uStack_130 = auVar39._0_8_;
      uStack_128 = auVar39._8_8_;
      auVar26._16_8_ = uStack_130;
      auVar26._0_16_ = auVar33;
      auVar26._24_8_ = uStack_128;
      auVar25[0x10] = '\x02';
      auVar25[0x11] = '\x02';
      auVar25[0x12] = '\x02';
      auVar25[0x13] = '\x02';
      auVar25[0x14] = '\x02';
      auVar25[0x15] = '\x02';
      auVar25[0x16] = '\x02';
      auVar25[0x17] = '\x02';
      auVar25._0_16_ = ZEXT816((ulong)0x101010101010101) << 0x40;
      auVar25[0x18] = '\x03';
      auVar25[0x19] = '\x03';
      auVar25[0x1a] = '\x03';
      auVar25[0x1b] = '\x03';
      auVar25[0x1c] = '\x03';
      auVar25[0x1d] = '\x03';
      auVar25[0x1e] = '\x03';
      auVar25[0x1f] = '\x03';
      auVar7 = vpshufb_avx2(auVar26,auVar25);
      auVar18[8] = '\x01';
      auVar18[9] = '\x02';
      auVar18[10] = '\x04';
      auVar18[0xb] = '\b';
      auVar18[0xc] = '\x10';
      auVar18[0xd] = ' ';
      auVar18[0xe] = '@';
      auVar18[0xf] = 0x80;
      auVar18[0] = '\x01';
      auVar18[1] = '\x02';
      auVar18[2] = '\x04';
      auVar18[3] = '\b';
      auVar18[4] = '\x10';
      auVar18[5] = ' ';
      auVar18[6] = '@';
      auVar18[7] = 0x80;
      auVar18[0x10] = '\x01';
      auVar18[0x11] = '\x02';
      auVar18[0x12] = '\x04';
      auVar18[0x13] = '\b';
      auVar18[0x14] = '\x10';
      auVar18[0x15] = ' ';
      auVar18[0x16] = '@';
      auVar18[0x17] = 0x80;
      auVar18[0x18] = '\x01';
      auVar18[0x19] = '\x02';
      auVar18[0x1a] = '\x04';
      auVar18[0x1b] = '\b';
      auVar18[0x1c] = '\x10';
      auVar18[0x1d] = ' ';
      auVar18[0x1e] = '@';
      auVar18[0x1f] = 0x80;
      auVar7 = vpand_avx2(auVar7,auVar18);
      auVar28[8] = '\x01';
      auVar28[9] = '\x02';
      auVar28[10] = '\x04';
      auVar28[0xb] = '\b';
      auVar28[0xc] = '\x10';
      auVar28[0xd] = ' ';
      auVar28[0xe] = '@';
      auVar28[0xf] = 0x80;
      auVar28[0] = '\x01';
      auVar28[1] = '\x02';
      auVar28[2] = '\x04';
      auVar28[3] = '\b';
      auVar28[4] = '\x10';
      auVar28[5] = ' ';
      auVar28[6] = '@';
      auVar28[7] = 0x80;
      auVar28[0x10] = '\x01';
      auVar28[0x11] = '\x02';
      auVar28[0x12] = '\x04';
      auVar28[0x13] = '\b';
      auVar28[0x14] = '\x10';
      auVar28[0x15] = ' ';
      auVar28[0x16] = '@';
      auVar28[0x17] = 0x80;
      auVar28[0x18] = '\x01';
      auVar28[0x19] = '\x02';
      auVar28[0x1a] = '\x04';
      auVar28[0x1b] = '\b';
      auVar28[0x1c] = '\x10';
      auVar28[0x1d] = ' ';
      auVar28[0x1e] = '@';
      auVar28[0x1f] = 0x80;
      auVar7 = vpcmpeqb_avx2(auVar7,auVar28);
      local_ae0 = auVar7._0_8_;
      uStack_ad8 = auVar7._8_8_;
      uStack_ad0 = auVar7._16_8_;
      uStack_ac8 = auVar7._24_8_;
      auVar8._8_8_ = uStack_ad8 ^ *puVar10;
      auVar8._0_8_ = local_ae0 ^ uVar3;
      auVar8._16_8_ = uStack_ad0 ^ *puVar11;
      auVar8._24_8_ = uStack_ac8 ^ *puVar12;
      auVar8 = vpsubb_avx2(auVar8,auVar7);
      uVar30 = local_980[1];
      auVar33 = vpinsrd_avx(ZEXT416(uVar30),uVar30,1);
      auVar33 = vpinsrd_avx(auVar33,uVar30,2);
      auVar33 = vpinsrd_avx(auVar33,uVar30,3);
      auVar39 = vpinsrd_avx(ZEXT416(uVar30),uVar30,1);
      auVar39 = vpinsrd_avx(auVar39,uVar30,2);
      auVar39 = vpinsrd_avx(auVar39,uVar30,3);
      uStack_f0 = auVar39._0_8_;
      uStack_e8 = auVar39._8_8_;
      auVar24._16_8_ = uStack_f0;
      auVar24._0_16_ = auVar33;
      auVar24._24_8_ = uStack_e8;
      auVar23[0x10] = '\x02';
      auVar23[0x11] = '\x02';
      auVar23[0x12] = '\x02';
      auVar23[0x13] = '\x02';
      auVar23[0x14] = '\x02';
      auVar23[0x15] = '\x02';
      auVar23[0x16] = '\x02';
      auVar23[0x17] = '\x02';
      auVar23._0_16_ = ZEXT816((ulong)0x101010101010101) << 0x40;
      auVar23[0x18] = '\x03';
      auVar23[0x19] = '\x03';
      auVar23[0x1a] = '\x03';
      auVar23[0x1b] = '\x03';
      auVar23[0x1c] = '\x03';
      auVar23[0x1d] = '\x03';
      auVar23[0x1e] = '\x03';
      auVar23[0x1f] = '\x03';
      auVar7 = vpshufb_avx2(auVar24,auVar23);
      auVar17[8] = '\x01';
      auVar17[9] = '\x02';
      auVar17[10] = '\x04';
      auVar17[0xb] = '\b';
      auVar17[0xc] = '\x10';
      auVar17[0xd] = ' ';
      auVar17[0xe] = '@';
      auVar17[0xf] = 0x80;
      auVar17[0] = '\x01';
      auVar17[1] = '\x02';
      auVar17[2] = '\x04';
      auVar17[3] = '\b';
      auVar17[4] = '\x10';
      auVar17[5] = ' ';
      auVar17[6] = '@';
      auVar17[7] = 0x80;
      auVar17[0x10] = '\x01';
      auVar17[0x11] = '\x02';
      auVar17[0x12] = '\x04';
      auVar17[0x13] = '\b';
      auVar17[0x14] = '\x10';
      auVar17[0x15] = ' ';
      auVar17[0x16] = '@';
      auVar17[0x17] = 0x80;
      auVar17[0x18] = '\x01';
      auVar17[0x19] = '\x02';
      auVar17[0x1a] = '\x04';
      auVar17[0x1b] = '\b';
      auVar17[0x1c] = '\x10';
      auVar17[0x1d] = ' ';
      auVar17[0x1e] = '@';
      auVar17[0x1f] = 0x80;
      auVar7 = vpand_avx2(auVar7,auVar17);
      auVar27[8] = '\x01';
      auVar27[9] = '\x02';
      auVar27[10] = '\x04';
      auVar27[0xb] = '\b';
      auVar27[0xc] = '\x10';
      auVar27[0xd] = ' ';
      auVar27[0xe] = '@';
      auVar27[0xf] = 0x80;
      auVar27[0] = '\x01';
      auVar27[1] = '\x02';
      auVar27[2] = '\x04';
      auVar27[3] = '\b';
      auVar27[4] = '\x10';
      auVar27[5] = ' ';
      auVar27[6] = '@';
      auVar27[7] = 0x80;
      auVar27[0x10] = '\x01';
      auVar27[0x11] = '\x02';
      auVar27[0x12] = '\x04';
      auVar27[0x13] = '\b';
      auVar27[0x14] = '\x10';
      auVar27[0x15] = ' ';
      auVar27[0x16] = '@';
      auVar27[0x17] = 0x80;
      auVar27[0x18] = '\x01';
      auVar27[0x19] = '\x02';
      auVar27[0x1a] = '\x04';
      auVar27[0x1b] = '\b';
      auVar27[0x1c] = '\x10';
      auVar27[0x1d] = ' ';
      auVar27[0x1e] = '@';
      auVar27[0x1f] = 0x80;
      uVar32 = vpcmpeqb_avx512vl(auVar7,auVar27);
      auVar7 = vpmovm2b_avx512vl(uVar32);
      local_b20 = auVar7._0_8_;
      uStack_b18 = auVar7._8_8_;
      uStack_b10 = auVar7._16_8_;
      uStack_b08 = auVar7._24_8_;
      auVar9._8_8_ = uStack_b18 ^ *puVar13;
      auVar9._0_8_ = local_b20 ^ *puVar29;
      auVar9._16_8_ = uStack_b10 ^ *puVar14;
      auVar9._24_8_ = uStack_b08 ^ *puVar15;
      auVar9 = vpsubb_avx2(auVar9,auVar7);
      local_980 = local_980 + 2;
      auVar7._16_8_ = uStack_2b0;
      auVar7._0_16_ = auVar34;
      auVar7._24_8_ = uStack_2a8;
      auVar7 = vpmaddubsw_avx2(auVar7,auVar8);
      auVar19._16_8_ = uStack_2f0;
      auVar19._0_16_ = auVar35;
      auVar19._24_8_ = uStack_2e8;
      auVar8 = vpmaddubsw_avx2(auVar19,auVar9);
      local_9c0 = auVar6._0_8_;
      uStack_9b8 = auVar6._8_8_;
      uStack_9b0 = auVar6._16_8_;
      uStack_9a8 = auVar6._24_8_;
      uVar32 = local_9c0;
      uVar36 = uStack_9b8;
      uVar37 = uStack_9b0;
      uVar38 = uStack_9a8;
      in_stack_fffffffffffff39c = uVar30;
      in_stack_fffffffffffff3a0 = local_9c0;
      in_stack_fffffffffffff3a8 = uStack_9b8;
      in_stack_fffffffffffff3b0 = uStack_9b0;
      get_scale_shuffle_k4((__m256i *)(ulong)local_a04,uVar30);
      auVar22._8_8_ = in_stack_fffffffffffff3a8;
      auVar22._0_8_ = in_stack_fffffffffffff3a0;
      auVar22._16_8_ = in_stack_fffffffffffff3b0;
      auVar22._24_8_ = uStack_9a8;
      auVar21._8_8_ = uVar36;
      auVar21._0_8_ = uVar32;
      auVar21._16_8_ = uVar37;
      auVar21._24_8_ = uVar38;
      auVar9 = vpshufb_avx2(auVar22,auVar21);
      auVar7 = vpmaddwd_avx2(auVar7,auVar9);
      get_scale_shuffle_k4((__m256i *)(ulong)(local_a04 + 1),uVar30);
      auVar20._8_8_ = uStack_9b8;
      auVar20._0_8_ = local_9c0;
      auVar20._16_8_ = uStack_9b0;
      auVar20._24_8_ = uStack_9a8;
      auVar9 = vpshufb_avx2(auVar6,auVar20);
      auVar8 = vpmaddwd_avx2(auVar8,auVar9);
      local_9e0 = vpaddd_avx2(local_9e0,auVar7);
      local_a00 = vpaddd_avx2(local_a00,auVar8);
      local_a04 = local_a04 + 2;
    }
    auVar33 = vinsertps_avx(ZEXT416((uint)fVar31),ZEXT416((uint)fVar31),0x10);
    auVar33 = vinsertps_avx(auVar33,ZEXT416((uint)fVar31),0x20);
    auVar33 = vinsertps_avx(auVar33,ZEXT416((uint)fVar31),0x30);
    auVar39 = vinsertps_avx(ZEXT416((uint)fVar31),ZEXT416((uint)fVar31),0x10);
    auVar39 = vinsertps_avx(auVar39,ZEXT416((uint)fVar31),0x20);
    auVar39 = vinsertps_avx(auVar39,ZEXT416((uint)fVar31),0x30);
    uStack_b0 = auVar33._0_8_;
    uStack_a8 = auVar33._8_8_;
    auVar6 = vpaddd_avx2(local_9e0,local_a00);
    auVar6 = vcvtdq2ps_avx(auVar6);
    auVar16._16_8_ = uStack_b0;
    auVar16._0_16_ = auVar39;
    auVar16._24_8_ = uStack_a8;
    local_960 = vfmadd213ps_fma(auVar6,auVar16,ZEXT1632(local_960));
  }
  x_00[1] = (float)in_stack_fffffffffffff39c;
  x_00[0] = (float)in_stack_fffffffffffff398;
  x_00[2] = (float)(int)in_stack_fffffffffffff3a0;
  x_00[3] = (float)(int)((ulong)in_stack_fffffffffffff3a0 >> 0x20);
  x_00[4] = (float)(int)in_stack_fffffffffffff3a8;
  x_00[5] = (float)(int)((ulong)in_stack_fffffffffffff3a8 >> 0x20);
  x_00[6] = (float)(int)in_stack_fffffffffffff3b0;
  x_00[7] = (float)(int)((ulong)in_stack_fffffffffffff3b0 >> 0x20);
  fVar31 = hsum_float_8(x_00);
  *in_RSI = fVar31 * 0.125;
  return;
}

Assistant:

void ggml_vec_dot_iq2_s_q8_K(int n, float * GGML_RESTRICT s, size_t bs, const void * GGML_RESTRICT vx, size_t bx, const void * GGML_RESTRICT vy, size_t by, int nrc) {
    assert(n % QK_K == 0);
    assert(nrc == 1);
    UNUSED(nrc);
    UNUSED(bx);
    UNUSED(by);
    UNUSED(bs);

    const block_iq2_s * GGML_RESTRICT x = vx;
    const block_q8_K  * GGML_RESTRICT y = vy;

    const int nb = n / QK_K;

#if defined(__ARM_NEON)

   static const uint8_t k_mask1[32] = {0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x01, 0x01, 0x01, 0x01, 0x01, 0x01, 0x01, 0x01,
                                       0x02, 0x02, 0x02, 0x02, 0x02, 0x02, 0x02, 0x02, 0x03, 0x03, 0x03, 0x03, 0x03, 0x03, 0x03, 0x03
   };

    static const uint8_t k_mask2[16] = {0x01, 0x02, 0x04, 0x08, 0x10, 0x20, 0x40, 0x80, 0x01, 0x02, 0x04, 0x08, 0x10, 0x20, 0x40, 0x80,};

    const ggml_uint8x16x2_t mask1 = ggml_vld1q_u8_x2(k_mask1);
    const uint8x16_t        mask2 = vld1q_u8(k_mask2);
    const uint8x16_t m1 = vdupq_n_u8(1);
    const int32x4_t vzero = vdupq_n_s32(0);

    uint8x16x2_t vs;
    ggml_int8x16x4_t q2s;
    ggml_int8x16x4_t q8b;

    float sumf = 0;
    for (int i = 0; i < nb; ++i) {

        const float d = GGML_FP16_TO_FP32(x[i].d) * y[i].d;

        const uint8_t * GGML_RESTRICT qs = x[i].qs;
        const uint8_t * GGML_RESTRICT qh = x[i].qh;
        const uint16_t * GGML_RESTRICT signs = (const uint16_t *)(x[i].qs + QK_K/8);
        const int8_t  * GGML_RESTRICT q8 = y[i].qs;

        int sumi1 = 0, sumi2 = 0;
        for (int ib32 = 0; ib32 < QK_K/32; ib32 += 2) {
            q8b = ggml_vld1q_s8_x4(q8); q8 += 64;
            q2s.val[0] = vcombine_s8(vld1_s8((const int8_t *)(iq2s_grid + (qs[0] | ((qh[ib32+0] << 8) & 0x300)))),
                                     vld1_s8((const int8_t *)(iq2s_grid + (qs[1] | ((qh[ib32+0] << 6) & 0x300)))));
            q2s.val[1] = vcombine_s8(vld1_s8((const int8_t *)(iq2s_grid + (qs[2] | ((qh[ib32+0] << 4) & 0x300)))),
                                     vld1_s8((const int8_t *)(iq2s_grid + (qs[3] | ((qh[ib32+0] << 2) & 0x300)))));
            q2s.val[2] = vcombine_s8(vld1_s8((const int8_t *)(iq2s_grid + (qs[4] | ((qh[ib32+1] << 8) & 0x300)))),
                                     vld1_s8((const int8_t *)(iq2s_grid + (qs[5] | ((qh[ib32+1] << 6) & 0x300)))));
            q2s.val[3] = vcombine_s8(vld1_s8((const int8_t *)(iq2s_grid + (qs[6] | ((qh[ib32+1] << 4) & 0x300)))),
                                     vld1_s8((const int8_t *)(iq2s_grid + (qs[7] | ((qh[ib32+1] << 2) & 0x300)))));
            qs += 8;

            vs.val[0] = vreinterpretq_u8_u32(vdupq_n_u32(signs[0] | ((uint32_t) signs[1] << 16)));
            vs.val[1] = vandq_u8(ggml_vqtbl1q_u8(vs.val[0], mask1.val[1]), mask2);
            vs.val[0] = vandq_u8(ggml_vqtbl1q_u8(vs.val[0], mask1.val[0]), mask2);
            vs.val[0] = vceqq_u8(vs.val[0], mask2);
            vs.val[1] = vceqq_u8(vs.val[1], mask2);

            q2s.val[0] = vmulq_s8(vreinterpretq_s8_u8(vorrq_u8(vs.val[0], m1)), q2s.val[0]);
            q2s.val[1] = vmulq_s8(vreinterpretq_s8_u8(vorrq_u8(vs.val[1], m1)), q2s.val[1]);

            vs.val[0] = vreinterpretq_u8_u32(vdupq_n_u32(signs[2] | ((uint32_t) signs[3] << 16)));
            vs.val[1] = vandq_u8(ggml_vqtbl1q_u8(vs.val[0], mask1.val[1]), mask2);
            vs.val[0] = vandq_u8(ggml_vqtbl1q_u8(vs.val[0], mask1.val[0]), mask2);
            vs.val[0] = vceqq_u8(vs.val[0], mask2);
            vs.val[1] = vceqq_u8(vs.val[1], mask2);

            signs += 4;

            q2s.val[2] = vmulq_s8(vreinterpretq_s8_u8(vorrq_u8(vs.val[0], m1)), q2s.val[2]);
            q2s.val[3] = vmulq_s8(vreinterpretq_s8_u8(vorrq_u8(vs.val[1], m1)), q2s.val[3]);

            const int32x4_t p1 = ggml_vdotq_s32(vzero, q2s.val[0], q8b.val[0]);
            const int32x4_t p2 = ggml_vdotq_s32(vzero, q2s.val[1], q8b.val[1]);
            const int32x4_t p3 = ggml_vdotq_s32(vzero, q2s.val[2], q8b.val[2]);
            const int32x4_t p4 = ggml_vdotq_s32(vzero, q2s.val[3], q8b.val[3]);

            sumi1 += vaddvq_s32(p1) * (1 + 2*(x[i].scales[ib32+0] & 0xf));
            sumi2 += vaddvq_s32(p2) * (1 + 2*(x[i].scales[ib32+0] >>  4));
            sumi1 += vaddvq_s32(p3) * (1 + 2*(x[i].scales[ib32+1] & 0xf));
            sumi2 += vaddvq_s32(p4) * (1 + 2*(x[i].scales[ib32+1] >>  4));
        }
        sumf += d*(sumi1 + sumi2);
    }

    *s = 0.125f * sumf;

#elif defined(__AVX2__)

   static const uint8_t k_mask1[32] = {0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x01, 0x01, 0x01, 0x01, 0x01, 0x01, 0x01, 0x01,
                                       0x02, 0x02, 0x02, 0x02, 0x02, 0x02, 0x02, 0x02, 0x03, 0x03, 0x03, 0x03, 0x03, 0x03, 0x03, 0x03
   };

    static const uint8_t k_mask2[32] = {0x01, 0x02, 0x04, 0x08, 0x10, 0x20, 0x40, 0x80, 0x01, 0x02, 0x04, 0x08, 0x10, 0x20, 0x40, 0x80,
                                        0x01, 0x02, 0x04, 0x08, 0x10, 0x20, 0x40, 0x80, 0x01, 0x02, 0x04, 0x08, 0x10, 0x20, 0x40, 0x80,
    };

    const __m128i m4 = _mm_set1_epi8(0xf);
    const __m128i m1 = _mm_set1_epi8(1);

    const __m256i mask1 = _mm256_loadu_si256((const __m256i*)k_mask1);
    const __m256i mask2 = _mm256_loadu_si256((const __m256i*)k_mask2);

    uint64_t aux64;

    __m256 accumf = _mm256_setzero_ps();
    for (int i = 0; i < nb; ++i) {
        const float d = GGML_FP16_TO_FP32(x[i].d) * y[i].d;
        const uint8_t * GGML_RESTRICT qs = x[i].qs;
        const uint8_t * GGML_RESTRICT qh = x[i].qh;
        const uint16_t * GGML_RESTRICT signs = (const uint16_t *)(x[i].qs + QK_K/8);
        const int8_t  * GGML_RESTRICT q8 = y[i].qs;

        memcpy(&aux64, x[i].scales, 8);
        const __m128i scales8 = _mm_add_epi8(_mm_slli_epi16(_mm_and_si128(_mm_set_epi64x(aux64 >> 4, aux64), m4), 1), m1);
        const __m256i scales16 = _mm256_cvtepi8_epi16(scales8); // 0 2 4 6 8 10 12 14 1 3 5 7 9 11 13 15

        __m256i sumi1 = _mm256_setzero_si256();
        __m256i sumi2 = _mm256_setzero_si256();
        for (int ib32 = 0; ib32 < QK_K/32; ib32 += 2) {
            const __m256i q8_1 = _mm256_loadu_si256((const __m256i *)q8); q8 += 32;
            const __m256i q8_2 = _mm256_loadu_si256((const __m256i *)q8); q8 += 32;
            const __m256i q2_1 = _mm256_set_epi64x(iq2s_grid[qs[3] | ((qh[ib32+0] << 2) & 0x300)],
                                                   iq2s_grid[qs[2] | ((qh[ib32+0] << 4) & 0x300)],
                                                   iq2s_grid[qs[1] | ((qh[ib32+0] << 6) & 0x300)],
                                                   iq2s_grid[qs[0] | ((qh[ib32+0] << 8) & 0x300)]);
            const __m256i q2_2 = _mm256_set_epi64x(iq2s_grid[qs[7] | ((qh[ib32+1] << 2) & 0x300)],
                                                   iq2s_grid[qs[6] | ((qh[ib32+1] << 4) & 0x300)],
                                                   iq2s_grid[qs[5] | ((qh[ib32+1] << 6) & 0x300)],
                                                   iq2s_grid[qs[4] | ((qh[ib32+1] << 8) & 0x300)]);
            qs += 8;

            __m256i aux256 = _mm256_set1_epi32(signs[0] | ((uint32_t) signs[1] << 16));
            aux256 = _mm256_and_si256(_mm256_shuffle_epi8(aux256,mask1), mask2);
            const __m256i s2_1 = _mm256_cmpeq_epi8(aux256, mask2);
            const __m256i q8s_1 = _mm256_sub_epi8(_mm256_xor_si256(s2_1, q8_1), s2_1);

            aux256 = _mm256_set1_epi32(signs[2] | ((uint32_t) signs[3] << 16));
            aux256 = _mm256_and_si256(_mm256_shuffle_epi8(aux256,mask1), mask2);
            const __m256i s2_2 = _mm256_cmpeq_epi8(aux256, mask2);
            const __m256i q8s_2 = _mm256_sub_epi8(_mm256_xor_si256(s2_2, q8_2), s2_2);

            signs += 4;

            const __m256i dot1  = _mm256_maddubs_epi16(q2_1, q8s_1); // blocks 2*ib32+0, 2*ib32+1
            const __m256i dot2  = _mm256_maddubs_epi16(q2_2, q8s_2); // blocks 2*ib32+2, 2*ib32+3

            const __m256i p1 = _mm256_madd_epi16(dot1, _mm256_shuffle_epi8(scales16, get_scale_shuffle_k4(ib32+0)));
            const __m256i p2 = _mm256_madd_epi16(dot2, _mm256_shuffle_epi8(scales16, get_scale_shuffle_k4(ib32+1)));
            sumi1 = _mm256_add_epi32(sumi1, p1);
            sumi2 = _mm256_add_epi32(sumi2, p2);
        }

        accumf = _mm256_fmadd_ps(_mm256_set1_ps(d), _mm256_cvtepi32_ps(_mm256_add_epi32(sumi1, sumi2)), accumf);

    }

    *s = 0.125f * hsum_float_8(accumf);

#elif defined(__AVX__)
   static const uint8_t k_mask1[32] = {0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x01, 0x01, 0x01, 0x01, 0x01, 0x01, 0x01, 0x01,
                                       0x02, 0x02, 0x02, 0x02, 0x02, 0x02, 0x02, 0x02, 0x03, 0x03, 0x03, 0x03, 0x03, 0x03, 0x03, 0x03
   };

    static const uint8_t k_mask2[32] = {0x01, 0x02, 0x04, 0x08, 0x10, 0x20, 0x40, 0x80, 0x01, 0x02, 0x04, 0x08, 0x10, 0x20, 0x40, 0x80,
                                        0x01, 0x02, 0x04, 0x08, 0x10, 0x20, 0x40, 0x80, 0x01, 0x02, 0x04, 0x08, 0x10, 0x20, 0x40, 0x80,
    };

    const __m128i m4 = _mm_set1_epi8(0xf);
    const __m128i m1 = _mm_set1_epi8(1);

    const __m128i mask1_0 = _mm_loadu_si128((const __m128i*)k_mask1);
    const __m128i mask1_1 = _mm_loadu_si128((const __m128i*)k_mask1 + 1);
    const __m128i mask2_0 = _mm_loadu_si128((const __m128i*)k_mask2);
    const __m128i mask2_1 = _mm_loadu_si128((const __m128i*)k_mask2 + 1);

    uint64_t aux64;

    __m256 accumf = _mm256_setzero_ps();
    for (int i = 0; i < nb; ++i) {
        const float d = GGML_FP16_TO_FP32(x[i].d) * y[i].d;
        const uint8_t * GGML_RESTRICT qs = x[i].qs;
        const uint8_t * GGML_RESTRICT qh = x[i].qh;
        const uint16_t * GGML_RESTRICT signs = (const uint16_t *)(x[i].qs + QK_K/8);
        const int8_t  * GGML_RESTRICT q8 = y[i].qs;

        memcpy(&aux64, x[i].scales, 8);
        const __m128i scales8 = _mm_add_epi8(_mm_slli_epi16(_mm_and_si128(_mm_set_epi64x(aux64 >> 4, aux64), m4), 1), m1);
        const __m128i scales16_0 = _mm_cvtepi8_epi16(scales8);
        const __m128i scales16_1 = _mm_cvtepi8_epi16(_mm_srli_si128(scales8, 8));

        __m128i sumi1_0 = _mm_setzero_si128();
        __m128i sumi1_1 = _mm_setzero_si128();
        __m128i sumi2_0 = _mm_setzero_si128();
        __m128i sumi2_1 = _mm_setzero_si128();
        for (int ib32 = 0; ib32 < QK_K/32; ib32 += 2) {
            const __m128i q8_1_0 = _mm_loadu_si128((const __m128i *)q8); q8 += 16;
            const __m128i q8_1_1 = _mm_loadu_si128((const __m128i *)q8); q8 += 16;
            const __m128i q8_2_0 = _mm_loadu_si128((const __m128i *)q8); q8 += 16;
            const __m128i q8_2_1 = _mm_loadu_si128((const __m128i *)q8); q8 += 16;
            const __m128i q2_1_0 = _mm_set_epi64x(iq2s_grid[qs[1] | ((qh[ib32+0] << 6) & 0x300)],
                                                  iq2s_grid[qs[0] | ((qh[ib32+0] << 8) & 0x300)]);
            const __m128i q2_1_1 = _mm_set_epi64x(iq2s_grid[qs[3] | ((qh[ib32+0] << 2) & 0x300)],
                                                  iq2s_grid[qs[2] | ((qh[ib32+0] << 4) & 0x300)]);
            const __m128i q2_2_0 = _mm_set_epi64x(iq2s_grid[qs[5] | ((qh[ib32+1] << 6) & 0x300)],
                                                  iq2s_grid[qs[4] | ((qh[ib32+1] << 8) & 0x300)]);
            const __m128i q2_2_1 = _mm_set_epi64x(iq2s_grid[qs[7] | ((qh[ib32+1] << 2) & 0x300)],
                                                  iq2s_grid[qs[6] | ((qh[ib32+1] << 4) & 0x300)]);
            qs += 8;

            __m128i aux128_0 = _mm_set1_epi32(signs[0] | ((uint32_t) signs[1] << 16));
            __m128i aux128_1 = aux128_0;
            aux128_0 = _mm_and_si128(_mm_shuffle_epi8(aux128_0,mask1_0), mask2_0);
            aux128_1 = _mm_and_si128(_mm_shuffle_epi8(aux128_1,mask1_1), mask2_1);
            const __m128i s2_1_0 = _mm_cmpeq_epi8(aux128_0, mask2_0);
            const __m128i s2_1_1 = _mm_cmpeq_epi8(aux128_1, mask2_1);
            const __m128i q8s_1_0 = _mm_sub_epi8(_mm_xor_si128(s2_1_0, q8_1_0), s2_1_0);
            const __m128i q8s_1_1 = _mm_sub_epi8(_mm_xor_si128(s2_1_1, q8_1_1), s2_1_1);

            aux128_0 = _mm_set1_epi32(signs[2] | ((uint32_t) signs[3] << 16));
            aux128_1 = aux128_0;
            aux128_0 = _mm_and_si128(_mm_shuffle_epi8(aux128_0,mask1_0), mask2_0);
            aux128_1 = _mm_and_si128(_mm_shuffle_epi8(aux128_1,mask1_1), mask2_1);
            const __m128i s2_2_0 = _mm_cmpeq_epi8(aux128_0, mask2_0);
            const __m128i s2_2_1 = _mm_cmpeq_epi8(aux128_1, mask2_1);
            const __m128i q8s_2_0 = _mm_sub_epi8(_mm_xor_si128(s2_2_0, q8_2_0), s2_2_0);
            const __m128i q8s_2_1 = _mm_sub_epi8(_mm_xor_si128(s2_2_1, q8_2_1), s2_2_1);

            signs += 4;

            const __m128i dot1_0  = _mm_maddubs_epi16(q2_1_0, q8s_1_0);
            const __m128i dot1_1  = _mm_maddubs_epi16(q2_1_1, q8s_1_1);
            const __m128i dot2_0  = _mm_maddubs_epi16(q2_2_0, q8s_2_0);
            const __m128i dot2_1  = _mm_maddubs_epi16(q2_2_1, q8s_2_1);

            const __m128i p1_0 = _mm_madd_epi16(dot1_0, _mm_shuffle_epi8(scales16_0, _mm256_extractf128_si256(get_scale_shuffle_k4(ib32+0), 0)));
            const __m128i p1_1 = _mm_madd_epi16(dot1_1, _mm_shuffle_epi8(scales16_1, _mm256_extractf128_si256(get_scale_shuffle_k4(ib32+0), 1)));
            const __m128i p2_0 = _mm_madd_epi16(dot2_0, _mm_shuffle_epi8(scales16_0, _mm256_extractf128_si256(get_scale_shuffle_k4(ib32+1), 0)));
            const __m128i p2_1 = _mm_madd_epi16(dot2_1, _mm_shuffle_epi8(scales16_1, _mm256_extractf128_si256(get_scale_shuffle_k4(ib32+1), 1)));
            sumi1_0 = _mm_add_epi32(sumi1_0, p1_0);
            sumi1_1 = _mm_add_epi32(sumi1_1, p1_1);
            sumi2_0 = _mm_add_epi32(sumi2_0, p2_0);
            sumi2_1 = _mm_add_epi32(sumi2_1, p2_1);
        }

        accumf = _mm256_add_ps(_mm256_mul_ps(_mm256_set1_ps(d), _mm256_cvtepi32_ps(MM256_SET_M128I(_mm_add_epi32(sumi1_1, sumi2_1), _mm_add_epi32(sumi1_0, sumi2_0)))), accumf);

    }

    *s = 0.125f * hsum_float_8(accumf);

#elif defined(__POWER9_VECTOR__)
    static const uint8_t k_mask1[32] = {0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x01, 0x01, 0x01, 0x01, 0x01, 0x01, 0x01, 0x01,
                                        0x02, 0x02, 0x02, 0x02, 0x02, 0x02, 0x02, 0x02, 0x03, 0x03, 0x03, 0x03, 0x03, 0x03, 0x03, 0x03
    };

    static const uint8_t k_mask2[16] = {0x01, 0x02, 0x04, 0x08, 0x10, 0x20, 0x40, 0x80, 0x01, 0x02, 0x04, 0x08, 0x10, 0x20, 0x40, 0x80,};

    const vector int v0 = vec_splats((int32_t)0);

    vector float vsumf0 = vec_splats(0.0f);
    vector float vsumf1 = vec_splats(0.0f);
    vector float vsumf2 = vec_splats(0.0f);
    vector float vsumf3 = vec_splats(0.0f);

    const vector unsigned char mask0 = vec_xl( 0, k_mask1);
    const vector unsigned char mask1 = vec_xl(16, k_mask1);
    const vector signed char mask2 = (vector signed char)vec_xl( 0, k_mask2);

    for (int i = 0; i < nb; ++i) {
        vector float vxd = vec_splats(GGML_FP16_TO_FP32(x[i].d));
        vector float vyd = vec_splats(y[i].d);
        vector float vd = vec_mul(vxd, vyd);

        vector signed int vsumi0 = v0;
        vector signed int vsumi1 = v0;
        vector signed int vsumi2 = v0;
        vector signed int vsumi3 = v0;

        const uint8_t *  GGML_RESTRICT q2 = x[i].qs;
        const uint8_t *  GGML_RESTRICT qh = x[i].qh;
        const uint16_t * GGML_RESTRICT signs = (const uint16_t *)(x[i].qs + QK_K/8);
        const uint8_t *  GGML_RESTRICT sc = x[i].scales;
        const int8_t  *  GGML_RESTRICT q8 = y[i].qs;

        for (int j = 0; j < QK_K/32; j += 2) {
            __builtin_prefetch(q2, 0, 1);
            __builtin_prefetch(q8, 0, 1);

            vector signed long long aux64x2_0 = {*(const int64_t *)(iq2s_grid + (q2[0] | ((qh[0] << 8) & 0x300))), *(const int64_t *)(iq2s_grid + (q2[1] | ((qh[0] << 6) & 0x300)))};
            vector signed long long aux64x2_1 = {*(const int64_t *)(iq2s_grid + (q2[2] | ((qh[0] << 4) & 0x300))), *(const int64_t *)(iq2s_grid + (q2[3] | ((qh[0] << 2) & 0x300)))};
            vector signed long long aux64x2_2 = {*(const int64_t *)(iq2s_grid + (q2[4] | ((qh[1] << 8) & 0x300))), *(const int64_t *)(iq2s_grid + (q2[5] | ((qh[1] << 6) & 0x300)))};
            vector signed long long aux64x2_3 = {*(const int64_t *)(iq2s_grid + (q2[6] | ((qh[1] << 4) & 0x300))), *(const int64_t *)(iq2s_grid + (q2[7] | ((qh[1] << 2) & 0x300)))};
            q2 += 8;
            qh += 2;

            vector signed char vsigns01 = (vector signed char)vec_splats(*(const uint32_t *)&signs[0]);
            vector signed char vsigns23 = (vector signed char)vec_splats(*(const uint32_t *)&signs[2]);
            signs += 4;

            vector signed char vsigns0 = vec_perm(vsigns01, vsigns01, mask0);
            vector signed char vsigns1 = vec_perm(vsigns01, vsigns01, mask1);
            vector signed char vsigns2 = vec_perm(vsigns23, vsigns23, mask0);
            vector signed char vsigns3 = vec_perm(vsigns23, vsigns23, mask1);

            vsigns0 = (vector signed char)vec_cmpeq(vec_and(vsigns0, mask2), mask2);
            vsigns1 = (vector signed char)vec_cmpeq(vec_and(vsigns1, mask2), mask2);
            vsigns2 = (vector signed char)vec_cmpeq(vec_and(vsigns2, mask2), mask2);
            vsigns3 = (vector signed char)vec_cmpeq(vec_and(vsigns3, mask2), mask2);

            vector signed char q2x0 = vec_sub(vec_xor(vsigns0, (vector signed char)aux64x2_0), vsigns0);
            vector signed char q2x1 = vec_sub(vec_xor(vsigns1, (vector signed char)aux64x2_1), vsigns1);
            vector signed char q2x2 = vec_sub(vec_xor(vsigns2, (vector signed char)aux64x2_2), vsigns2);
            vector signed char q2x3 = vec_sub(vec_xor(vsigns3, (vector signed char)aux64x2_3), vsigns3);

            vector signed char q8y0 = vec_xl( 0, q8);
            vector signed char q8y1 = vec_xl(16, q8);
            vector signed char q8y2 = vec_xl(32, q8);
            vector signed char q8y3 = vec_xl(48, q8);
            q8 += 64;

            vector signed short qv0 = vec_add(vec_mule(q2x0, q8y0), vec_mulo(q2x0, q8y0));
            vector signed short qv1 = vec_add(vec_mule(q2x1, q8y1), vec_mulo(q2x1, q8y1));
            vector signed short qv2 = vec_add(vec_mule(q2x2, q8y2), vec_mulo(q2x2, q8y2));
            vector signed short qv3 = vec_add(vec_mule(q2x3, q8y3), vec_mulo(q2x3, q8y3));

            const uint16_t ls0 = (uint16_t)(sc[0] & 0xf);
            const uint16_t ls1 = (uint16_t)(sc[0] >>  4);
            const uint16_t ls2 = (uint16_t)(sc[1] & 0xf);
            const uint16_t ls3 = (uint16_t)(sc[1] >>  4);
            sc += 2;

            vector signed short vscales0 = vec_splats((int16_t)(2*ls0+1));
            vector signed short vscales1 = vec_splats((int16_t)(2*ls1+1));
            vector signed short vscales2 = vec_splats((int16_t)(2*ls2+1));
            vector signed short vscales3 = vec_splats((int16_t)(2*ls3+1));

            vsumi0 = vec_msum(qv0, vscales0, vsumi0);
            vsumi1 = vec_msum(qv1, vscales1, vsumi1);
            vsumi2 = vec_msum(qv2, vscales2, vsumi2);
            vsumi3 = vec_msum(qv3, vscales3, vsumi3);
        }

        vsumf0 = vec_madd(vec_ctf(vsumi0, 0), vd, vsumf0);
        vsumf1 = vec_madd(vec_ctf(vsumi1, 0), vd, vsumf1);
        vsumf2 = vec_madd(vec_ctf(vsumi2, 0), vd, vsumf2);
        vsumf3 = vec_madd(vec_ctf(vsumi3, 0), vd, vsumf3);
    }

    vsumf0 = vec_add(vsumf0, vsumf2);
    vsumf1 = vec_add(vsumf1, vsumf3);

    vsumf0 = vec_add(vsumf0, vsumf1);

    vsumf0 = vec_add(vsumf0, vec_sld(vsumf0, vsumf0, 4));
    vsumf0 = vec_add(vsumf0, vec_sld(vsumf0, vsumf0, 8));

    *s = 0.125f * vec_extract(vsumf0, 0);

#elif defined(__loongarch_asx)

   static const uint8_t k_mask1[32] = {0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x01, 0x01, 0x01, 0x01, 0x01, 0x01, 0x01, 0x01,
                                       0x02, 0x02, 0x02, 0x02, 0x02, 0x02, 0x02, 0x02, 0x03, 0x03, 0x03, 0x03, 0x03, 0x03, 0x03, 0x03
   };

    static const uint8_t k_mask2[32] = {0x01, 0x02, 0x04, 0x08, 0x10, 0x20, 0x40, 0x80, 0x01, 0x02, 0x04, 0x08, 0x10, 0x20, 0x40, 0x80,
                                        0x01, 0x02, 0x04, 0x08, 0x10, 0x20, 0x40, 0x80, 0x01, 0x02, 0x04, 0x08, 0x10, 0x20, 0x40, 0x80,
    };


    const __m128i m4 = __lsx_vreplgr2vr_b(0xf);
    const __m128i m1 = __lsx_vreplgr2vr_b(1);

    const __m256i mask1 = __lasx_xvld((const __m256i*)k_mask1, 0);
    const __m256i mask2 = __lasx_xvld((const __m256i*)k_mask2, 0);
    uint64_t aux64;

    __m256 accumf = (__m256)__lasx_xvldi(0);
    for (int i = 0; i < nb; ++i) {
        const float d = GGML_FP16_TO_FP32(x[i].d) * y[i].d;
        const uint8_t * GGML_RESTRICT qs = x[i].qs;
        const uint8_t * GGML_RESTRICT qh = x[i].qh;
        const uint16_t * GGML_RESTRICT signs = (const uint16_t *)(x[i].qs + QK_K/8);
        const int8_t  * GGML_RESTRICT q8 = y[i].qs;

        __m128i tmp1;
        memcpy(&aux64, x[i].scales, 8);
        tmp1 = __lsx_vinsgr2vr_d(tmp1, aux64, 0);
        tmp1 = __lsx_vinsgr2vr_d(tmp1, aux64 >> 4, 1);
        const __m128i scales8 = __lsx_vadd_b(__lsx_vslli_h(__lsx_vand_v(tmp1, m4), 1), m1);
        const __m256i scales16 = lasx_ext8_16(scales8); // 0 2 4 6 8 10 12 14 1 3 5 7 9 11 13 15

        __m256i sumi1 = __lasx_xvldi(0);
        __m256i sumi2 = __lasx_xvldi(0);
        for (int ib32 = 0; ib32 < QK_K/32; ib32 += 2) {
            const __m256i q8_1 = __lasx_xvld((const __m256i *)q8, 0); q8 += 32;
            const __m256i q8_2 = __lasx_xvld((const __m256i *)q8, 0); q8 += 32;
            const __m256i q2_1 = lasx_set_d(iq2s_grid[qs[3] | ((qh[ib32+0] << 2) & 0x300)],
                                                   iq2s_grid[qs[2] | ((qh[ib32+0] << 4) & 0x300)],
                                                   iq2s_grid[qs[1] | ((qh[ib32+0] << 6) & 0x300)],
                                                   iq2s_grid[qs[0] | ((qh[ib32+0] << 8) & 0x300)]);
            const __m256i q2_2 = lasx_set_d(iq2s_grid[qs[7] | ((qh[ib32+1] << 2) & 0x300)],
                                                   iq2s_grid[qs[6] | ((qh[ib32+1] << 4) & 0x300)],
                                                   iq2s_grid[qs[5] | ((qh[ib32+1] << 6) & 0x300)],
                                                   iq2s_grid[qs[4] | ((qh[ib32+1] << 8) & 0x300)]);
            qs += 8;

            __m256i aux256 = __lasx_xvreplgr2vr_w(signs[0] | ((uint32_t) signs[1] << 16));
            aux256 = __lasx_xvand_v(lasx_shuffle_b(aux256,mask1), mask2);
            const __m256i s2_1 = __lasx_xvseq_b(aux256, mask2);
            const __m256i q8s_1 = __lasx_xvsub_b(__lasx_xvxor_v(s2_1, q8_1), s2_1);

            aux256 = __lasx_xvreplgr2vr_w(signs[2] | ((uint32_t) signs[3] << 16));
            aux256 = __lasx_xvand_v(lasx_shuffle_b(aux256,mask1), mask2);
            const __m256i s2_2 = __lasx_xvseq_b(aux256, mask2);
            const __m256i q8s_2 = __lasx_xvsub_b(__lasx_xvxor_v(s2_2, q8_2), s2_2);

            signs += 4;

            const __m256i dot1  = lasx_maddubs_h(q2_1, q8s_1); // blocks 2*ib32+0, 2*ib32+1
            const __m256i dot2  = lasx_maddubs_h(q2_2, q8s_2); // blocks 2*ib32+2, 2*ib32+3

            const __m256i p1 = lasx_madd_h(dot1, lasx_shuffle_b(scales16, get_scale_shuffle_k4(ib32+0)));
            const __m256i p2 = lasx_madd_h(dot2, lasx_shuffle_b(scales16, get_scale_shuffle_k4(ib32+1)));
            sumi1 = __lasx_xvadd_w(sumi1, p1);
            sumi2 = __lasx_xvadd_w(sumi2, p2);
        }

        accumf = __lasx_xvfmadd_s(__lasx_xvreplfr2vr_s(d), __lasx_xvffint_s_w(__lasx_xvadd_w(sumi1, sumi2)), accumf);
    }

    *s = 0.125f * hsum_float_8(accumf);

#else

    float sumf = 0;
    for (int i = 0; i < nb; i++) {

        const float d = GGML_FP16_TO_FP32(x[i].d) * y[i].d;
        const int8_t  * q8 = y[i].qs;
        const uint8_t * qs = x[i].qs;
        const uint8_t * qh = x[i].qh;
        const uint8_t * signs = qs + QK_K/8;

        int bsum = 0;
        for (int ib32 = 0; ib32 < QK_K/32; ++ib32) {
            int ls1 = 1 + 2*(x[i].scales[ib32] & 0xf);
            int ls2 = 1 + 2*(x[i].scales[ib32] >>  4);
            int sumi1 = 0, sumi2 = 0;
            for (int l = 0; l < 2; ++l) {
                const uint8_t * grid = (const uint8_t *)(iq2s_grid + (qs[l] | (qh[ib32] << (8-2*l) & 0x300)));
                for (int j = 0; j < 8; ++j) {
                    sumi1 += q8[j] * grid[j] * (signs[l] & kmask_iq2xs[j] ? -1 : 1);
                }
                q8 += 8;
            }
            for (int l = 2; l < 4; ++l) {
                const uint8_t * grid = (const uint8_t *)(iq2s_grid + (qs[l] | (qh[ib32] << (8-2*l) & 0x300)));
                for (int j = 0; j < 8; ++j) {
                    sumi2 += q8[j] * grid[j] * (signs[l] & kmask_iq2xs[j] ? -1 : 1);
                }
                q8 += 8;
            }
            bsum += ls1 * sumi1 + ls2 * sumi2;
            qs += 4;
            signs += 4;
        }

        sumf += d * bsum;
    }

    *s = 0.125f * sumf;

#endif

}